

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

optional<Patch::Change> * __thiscall
Patch::get_bounds(optional<Patch::Change> *__return_storage_ptr__,Patch *this)

{
  Point PVar1;
  Point PVar2;
  Change local_98;
  Point local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  Point new_end;
  Point old_end;
  Point new_start;
  Point old_start;
  Node *node;
  Patch *this_local;
  
  if (this->root == (Node *)0x0) {
    optional<Patch::Change>::optional(__return_storage_ptr__);
  }
  else {
    for (old_start = (Point)this->root; *(long *)old_start != 0; old_start = *(Point *)old_start) {
    }
    PVar1 = *(Point *)((long)old_start + 0x20);
    PVar2 = *(Point *)((long)old_start + 0x28);
    old_start = (Point)this->root;
    Point::Point(&new_end);
    Point::Point(&local_38);
    for (; old_start != (Point)0x0; old_start = *(Point *)((long)old_start + 8)) {
      local_48 = Point::traverse((Point *)((long)old_start + 0x20),(Point *)((long)old_start + 0x10)
                                );
      local_40 = Point::traverse(&new_end,&local_48);
      new_end = local_40;
      local_58 = Point::traverse((Point *)((long)old_start + 0x28),(Point *)((long)old_start + 0x18)
                                );
      local_50 = Point::traverse(&local_38,&local_58);
      local_38 = local_50;
    }
    local_98.old_end = new_end;
    local_98.new_end = local_38;
    local_98.old_text = (Text *)0x0;
    local_98.new_text = (Text *)0x0;
    local_98.preceding_old_text_size = 0;
    local_98.preceding_new_text_size = 0;
    local_98.old_text_size = 0;
    local_98.old_start = PVar1;
    local_98.new_start = PVar2;
    optional<Patch::Change>::optional(__return_storage_ptr__,&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<Change> Patch::get_bounds() const {
  if (!root) return optional<Change>{};

  Node *node = root;
  while (node->left) {
    node = node->left;
  }

  Point old_start = node->old_distance_from_left_ancestor;
  Point new_start = node->new_distance_from_left_ancestor;

  node = root;
  Point old_end, new_end;
  while (node) {
    old_end = old_end.traverse(node->old_distance_from_left_ancestor.traverse(node->old_extent));
    new_end = new_end.traverse(node->new_distance_from_left_ancestor.traverse(node->new_extent));
    node = node->right;
  }

  return Change{
    old_start, old_end,
    new_start, new_end,
    nullptr, nullptr,
    0, 0, 0
  };
}